

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall CoreTest_Format_Test::TestBody(CoreTest_Format_Test *this)

{
  undefined1 uVar1;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  char (*in_stack_ffffffffffffffc8) [3];
  AssertionResult local_18;
  
  uVar2 = 0x2a;
  expected = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc8;
  fmt::v5::format<char[3],int>
            (in_stack_ffffffffffffffc8,(int *)CONCAT44(0x2a,in_stack_ffffffffffffffc0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,expected,
             (char (*) [3])CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
    testing::AssertionResult::failure_message((AssertionResult *)0x123811);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::Message::~Message((Message *)0x12385d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12389d);
  return;
}

Assistant:

TEST(CoreTest, Format) {
  // This should work without including fmt/format.h.
#ifdef FMT_FORMAT_H_
# error fmt/format.h must not be included in the core test
#endif
  EXPECT_EQ(fmt::format("{}", 42), "42");
}